

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void processImage(Mat *inputImg,char imageId)

{
  char *pcVar1;
  ostream *poVar2;
  string fileName;
  Mat newImg;
  tuple<bool,_float,_cv::Mat> output2;
  tuple<bool,_float,_cv::Mat> output3;
  tuple<bool,_float,_cv::Mat> output;
  string asStack_1f8 [32];
  _Vector_base<int,_std::allocator<int>_> local_1d8;
  _InputArray local_1c0;
  Mat local_1a8 [96];
  tuple<bool,_float,_cv::Mat> local_148;
  tuple<bool,_float,_cv::Mat> local_e0;
  tuple<bool,_float,_cv::Mat> local_78;
  
  removeNoiseIfPresent(&local_78,inputImg);
  if (local_78.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.super__Tuple_impl<1UL,_float,_cv::Mat>.
      _100_1_ == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"No noise!");
    poVar2 = std::operator<<(poVar2," ");
    pcVar1 = "Noise %: ";
  }
  else {
    pcVar1 = "Noisy: ";
    poVar2 = (ostream *)&std::cout;
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,local_78.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                             super__Tuple_impl<1UL,_float,_cv::Mat>.
                             super__Head_base<1UL,_float,_false>._M_head_impl);
  poVar2 = std::operator<<(poVar2,"%");
  std::endl<char,std::char_traits<char>>(poVar2);
  cv::Mat::Mat(local_1a8,(Mat *)&local_78);
  removeBlurIfPresent(&local_148,local_1a8);
  if (local_148.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.super__Tuple_impl<1UL,_float,_cv::Mat>.
      _100_1_ == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"No Blur! ");
    pcVar1 = "Blur %: ";
  }
  else {
    pcVar1 = "Blurry: ";
    poVar2 = (ostream *)&std::cout;
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,local_148.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                             super__Tuple_impl<1UL,_float,_cv::Mat>.
                             super__Head_base<1UL,_float,_false>._M_head_impl);
  poVar2 = std::operator<<(poVar2,"%");
  std::endl<char,std::char_traits<char>>(poVar2);
  cv::Mat::operator=(local_1a8,(Mat *)&local_148);
  removeCollapsnessIfPresent(&local_e0,local_1a8);
  if (local_e0.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.super__Tuple_impl<1UL,_float,_cv::Mat>.
      _100_1_ == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"No Collapsness! ");
    pcVar1 = "Collapsness %: ";
  }
  else {
    pcVar1 = "Collapsed: ";
    poVar2 = (ostream *)&std::cout;
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,local_e0.super__Tuple_impl<0UL,_bool,_float,_cv::Mat>.
                             super__Tuple_impl<1UL,_float,_cv::Mat>.
                             super__Head_base<1UL,_float,_false>._M_head_impl);
  poVar2 = std::operator<<(poVar2,"%");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string(asStack_1f8,"fixed",(allocator *)&local_1c0);
  std::__cxx11::string::push_back((char)asStack_1f8);
  std::__cxx11::string::append((char *)asStack_1f8);
  local_1c0.sz.width = 0;
  local_1c0.sz.height = 0;
  local_1c0.flags = 0x1010000;
  local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0.obj = &local_e0;
  cv::imwrite(asStack_1f8,&local_1c0,(vector *)&local_1d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1d8);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(asStack_1f8);
  cv::Mat::~Mat((Mat *)&local_e0);
  cv::Mat::~Mat((Mat *)&local_148);
  cv::Mat::~Mat(local_1a8);
  cv::Mat::~Mat((Mat *)&local_78);
  return;
}

Assistant:

void processImage(Mat const& inputImg, char imageId) {
    tuple<bool,float,Mat> output = removeNoiseIfPresent(inputImg);
    if (get<0>(output)) {
        cout << "Noisy: " << get<1>(output)<<"%"<<endl;
    } else {
        cout<<"No noise!"<< " " << "Noise %: " <<get<1>(output)<<"%"<<endl;
    }

    Mat newImg = get<2>(output);
    tuple<bool,float,Mat> output2= removeBlurIfPresent(newImg);
    if (get<0>(output2)) {
        cout << "Blurry: " << get<1>(output2)<<"%"<<endl;
    } else {
        cout<<"No Blur! "<<"Blur %: "<< get<1>(output2)<<"%"<<endl;
    }

    newImg = get<2>(output2);
    tuple<bool,float,Mat> output3= removeCollapsnessIfPresent(newImg);
    if (get<0>(output3)) {
        cout << "Collapsed: " << get<1>(output3)<<"%"<<endl;
    } else {
        cout<<"No Collapsness! "<<"Collapsness %: "<< get<1>(output3)<<"%"<<endl;
    }
    string fileName = "fixed";
    fileName += imageId;
    fileName += ".jpg";

    imwrite(fileName, get<2>(output3));
    cout << "-----------------------------------------------------------------------------" <<endl;
}